

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::BranchLayerParams::SharedDtor(BranchLayerParams *this)

{
  ulong uVar1;
  NeuralNetwork *pNVar2;
  undefined8 *puVar3;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if (puVar3 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x47b9);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  if (this != (BranchLayerParams *)_BranchLayerParams_default_instance_) {
    pNVar2 = this->ifbranch_;
    if (pNVar2 != (NeuralNetwork *)0x0) {
      NeuralNetwork::~NeuralNetwork(pNVar2);
    }
    operator_delete(pNVar2,0x58);
    pNVar2 = this->elsebranch_;
    if (pNVar2 != (NeuralNetwork *)0x0) {
      NeuralNetwork::~NeuralNetwork(pNVar2);
    }
    operator_delete(pNVar2,0x58);
  }
  return;
}

Assistant:

inline void BranchLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete ifbranch_;
  if (this != internal_default_instance()) delete elsebranch_;
}